

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uniset.cpp
# Opt level: O0

UnicodeSet * __thiscall icu_63::UnicodeSet::complement(UnicodeSet *this,UChar32 start,UChar32 end)

{
  UBool UVar1;
  UChar32 UVar2;
  UChar32 UVar3;
  UChar32 local_2c;
  int local_28;
  UChar32 range [3];
  UChar32 end_local;
  UChar32 start_local;
  UnicodeSet *this_local;
  
  range[1] = end;
  range[2] = start;
  UVar1 = isFrozen(this);
  if ((UVar1 == '\0') && (UVar1 = isBogus(this), UVar1 == '\0')) {
    UVar2 = pinCodePoint(range + 2);
    UVar3 = pinCodePoint(range + 1);
    if (UVar2 <= UVar3) {
      local_2c = range[2];
      local_28 = range[1] + 1;
      range[0] = 0x110000;
      exclusiveOr(this,&local_2c,2,'\0');
    }
    releasePattern(this);
  }
  return this;
}

Assistant:

UnicodeSet& UnicodeSet::complement(UChar32 start, UChar32 end) {
    if (isFrozen() || isBogus()) {
        return *this;
    }
    if (pinCodePoint(start) <= pinCodePoint(end)) {
        UChar32 range[3] = { start, end+1, UNICODESET_HIGH };
        exclusiveOr(range, 2, 0);
    }
    releasePattern();
    return *this;
}